

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead.c
# Opt level: O3

lookahead_ctx *
av1_lookahead_init(uint width,uint height,uint subsampling_x,uint subsampling_y,int use_highbitdepth
                  ,uint depth,int border_in_pixels,int byte_alignment,int num_lap_buffers,
                  _Bool is_all_intra,_Bool alloc_pyramid)

{
  int iVar1;
  lookahead_ctx *ctx;
  lookahead_entry *ybf;
  ulong __nmemb;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = depth + num_lap_buffers;
  uVar4 = 0x60;
  if (uVar3 < 0x60) {
    uVar4 = uVar3;
  }
  uVar2 = 1;
  if (0 < (int)uVar3) {
    uVar2 = uVar4;
  }
  ctx = (lookahead_ctx *)calloc(1,0x38);
  if (ctx != (lookahead_ctx *)0x0) {
    uVar4 = !is_all_intra + uVar2;
    ctx->max_sz = uVar4;
    ctx->max_pre_frames = !is_all_intra;
    ctx->read_ctxs[0].pop_sz = uVar2;
    ctx->read_ctxs[0].valid = 1;
    if (num_lap_buffers != 0) {
      ctx->read_ctxs[1].pop_sz = depth + (depth == 0);
      ctx->read_ctxs[1].valid = 1;
    }
    __nmemb = (ulong)uVar4;
    ybf = (lookahead_entry *)calloc(__nmemb,0xf0);
    ctx->buf = ybf;
    if (ybf != (lookahead_entry *)0x0) {
      if (uVar4 == 0) {
        return ctx;
      }
      while (iVar1 = aom_realloc_frame_buffer
                               (&ybf->img,width,height,subsampling_x,subsampling_y,use_highbitdepth,
                                border_in_pixels,byte_alignment,(aom_codec_frame_buffer_t *)0x0,
                                (aom_get_frame_buffer_cb_fn_t)0x0,(void *)0x0,alloc_pyramid,0),
            iVar1 == 0) {
        ybf = ybf + 1;
        __nmemb = __nmemb - 1;
        if (__nmemb == 0) {
          return ctx;
        }
      }
    }
    av1_lookahead_destroy(ctx);
  }
  return (lookahead_ctx *)0x0;
}

Assistant:

struct lookahead_ctx *av1_lookahead_init(
    unsigned int width, unsigned int height, unsigned int subsampling_x,
    unsigned int subsampling_y, int use_highbitdepth, unsigned int depth,
    const int border_in_pixels, int byte_alignment, int num_lap_buffers,
    bool is_all_intra, bool alloc_pyramid) {
  int lag_in_frames = AOMMAX(1, depth);

  // For all-intra frame encoding, previous source frames are not required.
  // Hence max_pre_frames is set to 0 in this case. As previous source frames
  // are accessed using a negative index to av1_lookahead_peek(), setting
  // max_pre_frames to 0 will cause av1_lookahead_peek() to return NULL for a
  // negative index.
  const uint8_t max_pre_frames = is_all_intra ? 0 : MAX_PRE_FRAMES;

  // Add the lags to depth and clamp
  depth += num_lap_buffers;
  depth = clamp(depth, 1, MAX_TOTAL_BUFFERS);

  // Allocate memory to keep previous source frames available.
  depth += max_pre_frames;

  // Allocate the lookahead structures
  struct lookahead_ctx *ctx = calloc(1, sizeof(*ctx));
  if (ctx) {
    unsigned int i;
    ctx->max_sz = depth;
    ctx->push_frame_count = 0;
    ctx->max_pre_frames = max_pre_frames;
    ctx->read_ctxs[ENCODE_STAGE].pop_sz = ctx->max_sz - ctx->max_pre_frames;
    ctx->read_ctxs[ENCODE_STAGE].valid = 1;
    if (num_lap_buffers) {
      ctx->read_ctxs[LAP_STAGE].pop_sz = lag_in_frames;
      ctx->read_ctxs[LAP_STAGE].valid = 1;
    }
    ctx->buf = calloc(depth, sizeof(*ctx->buf));
    if (!ctx->buf) goto fail;
    for (i = 0; i < depth; i++) {
      if (aom_realloc_frame_buffer(
              &ctx->buf[i].img, width, height, subsampling_x, subsampling_y,
              use_highbitdepth, border_in_pixels, byte_alignment, NULL, NULL,
              NULL, alloc_pyramid, 0)) {
        goto fail;
      }
    }
  }
  return ctx;
fail:
  av1_lookahead_destroy(ctx);
  return NULL;
}